

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O3

int __thiscall FileTokenizer::init(FileTokenizer *this,EVP_PKEY_CTX *ctx)

{
  string *this_00;
  undefined8 uVar1;
  pointer pcVar2;
  _List_node_base *p_Var3;
  size_t sVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  string local_180;
  ValueType *local_160;
  undefined1 local_158 [64];
  _Alloc_hider local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  undefined1 local_f8 [64];
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  Token local_90;
  
  std::__cxx11::_List_base<Token,_std::allocator<Token>_>::_M_clear
            ((_List_base<Token,_std::allocator<Token>_> *)this);
  (this->super_Tokenizer).tokens.super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this;
  (this->super_Tokenizer).tokens.super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this;
  (this->super_Tokenizer).tokens.super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
  _M_size = 0;
  this->lineNumber = 1;
  this->linePos = 0;
  this->equActive = false;
  TextFile::readLine_abi_cxx11_(&local_180,(TextFile *)ctx);
  this_00 = &this->currentLine;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  this->input = (TextFile *)ctx;
  if ((ctx[0x269] == (EVP_PKEY_CTX)0x0) &&
     (cVar5 = std::__basic_file<char>::is_open(), cVar5 == '\0')) {
    iVar7 = 0;
  }
  else {
    local_160 = &(this->token).value;
    uVar8 = this->linePos;
LAB_0014d5ab:
    while ((uVar8 < (this->currentLine)._M_string_length ||
           (bVar6 = TextFile::atEnd(this->input), !bVar6))) {
      skipWhitespace(this);
      uVar8 = this->linePos;
      if ((this->currentLine)._M_string_length <= uVar8) goto LAB_0014d779;
      if ((this_00->_M_dataplus)._M_p[uVar8] != '\\') goto LAB_0014d712;
      this->linePos = uVar8 + 1;
      skipWhitespace(this);
      if (this->linePos < (this->currentLine)._M_string_length) {
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_180,"Unexpected character after line continuation character","")
        ;
        createToken(this,Invalid,0,&local_180,0,local_180._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
        local_158._0_8_ = (this->token).line;
        local_158._8_5_ = (undefined5)(this->token).column;
        uVar1 = *(undefined8 *)((long)&(this->token).column + 5);
        local_158._13_3_ = (undefined3)uVar1;
        local_158._16_5_ = (undefined5)((ulong)uVar1 >> 0x18);
        std::__detail::__variant::
        _Copy_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::
        _Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                         *)(local_158 + 0x18),
                        (_Copy_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                         *)local_160);
        local_118._M_p = (pointer)&local_108;
        pcVar2 = (this->token).originalText._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_118,pcVar2,pcVar2 + (this->token).originalText._M_string_length)
        ;
        std::__cxx11::list<Token,_std::allocator<Token>_>::_M_insert<Token>
                  ((list<Token,_std::allocator<Token>_> *)this,(iterator)this,(Token *)local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_p != &local_108) {
          operator_delete(local_118._M_p,local_108._M_allocated_capacity + 1);
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::
        ~_Variant_storage((_Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                           *)(local_158 + 0x18));
      }
      uVar8 = this->linePos;
      if ((this->currentLine)._M_string_length <= uVar8) goto LAB_0014d823;
    }
LAB_0014d87a:
    p_Var3 = (this->super_Tokenizer).tokens.super__List_base<Token,_std::allocator<Token>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    (this->super_Tokenizer).position.it._M_node = p_Var3;
    iVar7 = (int)CONCAT71((int7)((ulong)p_Var3 >> 8),1);
  }
  return iVar7;
LAB_0014d712:
  loadToken(&local_90,this);
  std::__cxx11::list<Token,_std::allocator<Token>_>::_M_insert<Token>
            ((list<Token,_std::allocator<Token>_> *)this,(iterator)this,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.originalText._M_dataplus._M_p != &local_90.originalText.field_2) {
    operator_delete(local_90.originalText._M_dataplus._M_p,
                    local_90.originalText.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::
  ~_Variant_storage((_Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                     *)&local_90.value);
  uVar8 = this->linePos;
  if ((this->currentLine)._M_string_length <= uVar8) {
LAB_0014d779:
    createToken(this,Separator,0);
    local_f8._16_5_ = (undefined5)((ulong)*(undefined8 *)((long)&(this->token).column + 5) >> 0x18);
    local_f8._0_8_ = (this->token).line;
    sVar4 = (this->token).column;
    local_f8._8_5_ = (undefined5)sVar4;
    local_f8._13_3_ = (undefined3)(sVar4 >> 0x28);
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier> *)
               (local_f8 + 0x18),
               (_Copy_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier> *)
               local_160);
    local_b8._M_p = (pointer)&local_a8;
    pcVar2 = (this->token).originalText._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,pcVar2,pcVar2 + (this->token).originalText._M_string_length);
    std::__cxx11::list<Token,_std::allocator<Token>_>::_M_insert<Token>
              ((list<Token,_std::allocator<Token>_> *)this,(iterator)this,(Token *)local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_p != &local_a8) {
      operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::
    ~_Variant_storage((_Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                       *)(local_f8 + 0x18));
LAB_0014d823:
    bVar6 = TextFile::atEnd((TextFile *)ctx);
    if (bVar6) goto LAB_0014d87a;
    TextFile::readLine_abi_cxx11_(&local_180,(TextFile *)ctx);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_180);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    }
    this->linePos = 0;
    this->lineNumber = this->lineNumber + 1;
    uVar8 = 0;
  }
  goto LAB_0014d5ab;
}

Assistant:

bool FileTokenizer::init(TextFile* input)
{
	clearTokens();

	lineNumber = 1;
	linePos = 0;
	equActive = false;
	currentLine = input->readLine();

	this->input = input;
	if (input != nullptr && input->isOpen())
	{
		while (!isInputAtEnd())
		{
			bool addSeparator = true;

			skipWhitespace();
			if (isContinuation(currentLine, linePos))
			{
				linePos++;
				skipWhitespace();
				if (linePos < currentLine.size())
				{
					createToken(TokenType::Invalid,0,
						"Unexpected character after line continuation character");
					addToken(token);
				}

				addSeparator = false;
			} else if(linePos < currentLine.size())
			{
				addToken(loadToken());
			}

			if (linePos >= currentLine.size())
			{
				if (addSeparator)
				{
					createToken(TokenType::Separator,0);
					addToken(token);
				}

				if (input->atEnd())
					break;

				currentLine = input->readLine();
				linePos = 0;
				lineNumber++;
			}
		}

		resetPosition();
		return true;
	}

	return false;
}